

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_obj.c
# Opt level: O0

void do_remove(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  OBJ_DATA *arg1;
  long in_RDI;
  OBJ_DATA *obj_next;
  OBJ_DATA *obj;
  char arg [4608];
  CHAR_DATA *in_stack_ffffffffffffedd8;
  long lVar2;
  char *in_stack_ffffffffffffede0;
  long lVar3;
  char in_stack_ffffffffffffede8;
  uint7 in_stack_ffffffffffffede9;
  char *in_stack_ffffffffffffedf0;
  undefined1 in_stack_ffffffffffffee03;
  int in_stack_ffffffffffffee04;
  CHAR_DATA *in_stack_ffffffffffffee08;
  undefined7 in_stack_ffffffffffffee10;
  undefined1 in_stack_ffffffffffffee17;
  CHAR_DATA *in_stack_ffffffffffffee18;
  CHAR_DATA *in_stack_ffffffffffffee20;
  char *in_stack_ffffffffffffffe0;
  CHAR_DATA *in_stack_ffffffffffffffe8;
  
  one_argument(in_stack_ffffffffffffede0,(char *)in_stack_ffffffffffffedd8);
  if (in_stack_ffffffffffffede8 == '\0') {
    send_to_char(in_stack_ffffffffffffedf0,(CHAR_DATA *)((ulong)in_stack_ffffffffffffede9 << 8));
  }
  else {
    bVar1 = str_cmp(&stack0xffffffffffffede8,"all");
    if (bVar1) {
      arg1 = get_obj_wear(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
      if (arg1 == (OBJ_DATA *)0x0) {
        send_to_char(in_stack_ffffffffffffedf0,
                     (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffede9,in_stack_ffffffffffffede8));
      }
      else if (arg1->wear_loc == 0x15) {
        act(in_stack_ffffffffffffedf0,
            (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffede9,in_stack_ffffffffffffede8),arg1,
            in_stack_ffffffffffffedd8,0);
        act(in_stack_ffffffffffffedf0,
            (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffede9,in_stack_ffffffffffffede8),arg1,
            in_stack_ffffffffffffedd8,0);
        unequip_char(in_stack_ffffffffffffee20,(OBJ_DATA *)in_stack_ffffffffffffee18,
                     (bool)in_stack_ffffffffffffee17);
      }
      else if ((arg1->wear_loc != 0x13) || (bVar1 = is_immortal(in_stack_ffffffffffffedd8), bVar1))
      {
        remove_obj(in_stack_ffffffffffffee08,in_stack_ffffffffffffee04,
                   (bool)in_stack_ffffffffffffee03);
      }
      else {
        send_to_char(in_stack_ffffffffffffedf0,
                     (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffede9,in_stack_ffffffffffffede8));
      }
    }
    else {
      lVar2 = *(long *)(in_RDI + 0x98);
      while (lVar3 = lVar2, lVar3 != 0) {
        lVar2 = *(long *)(lVar3 + 8);
        if (((*(short *)(lVar3 + 0x100) != -1) &&
            (bVar1 = can_see_obj(in_stack_ffffffffffffee18,
                                 (OBJ_DATA *)
                                 CONCAT17(in_stack_ffffffffffffee17,in_stack_ffffffffffffee10)),
            bVar1)) && (*(short *)(lVar3 + 0x100) != 0x13)) {
          remove_obj(in_stack_ffffffffffffee08,in_stack_ffffffffffffee04,
                     (bool)in_stack_ffffffffffffee03);
        }
      }
    }
  }
  return;
}

Assistant:

void do_remove(CHAR_DATA *ch, char *argument)
{
	char arg[MAX_INPUT_LENGTH];
	OBJ_DATA *obj;

	one_argument(argument, arg);

	if (arg[0] == '\0')
	{
		send_to_char("Remove what?\n\r", ch);
		return;
	}

	if (!str_cmp(arg, "all"))
	{
		OBJ_DATA *obj_next;

		for (obj = ch->carrying; obj != nullptr; obj = obj_next)
		{
			obj_next = obj->next_content;

			if (obj->wear_loc != WEAR_NONE && can_see_obj(ch, obj) && obj->wear_loc != WEAR_BRAND)
				remove_obj(ch, obj->wear_loc, true);
		}

		return;
	}
	else
	{
		obj = get_obj_wear(ch, arg);

		if (obj == nullptr)
		{
			send_to_char("You do not have that item.\n\r", ch);
			return;
		}
	}

	if (obj->wear_loc == WEAR_COSMETIC)
	{
		act("$n stops using $p.", ch, obj, nullptr, TO_ROOM);
		act("You stop using $p.", ch, obj, nullptr, TO_CHAR);
		unequip_char(ch, obj, true);
		return;
	}

	if (obj->wear_loc == WEAR_BRAND && !is_immortal(ch))
	{
		send_to_char("You can't remove a tattoo!\n\r", ch);
		return;
	}

	remove_obj(ch, obj->wear_loc, true);
}